

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_aux_del(bam1_t *b,uint8_t *s)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint8_t *__src;
  ulong uVar5;
  int iVar6;
  
  iVar1 = b->l_data;
  uVar5 = *(ulong *)&(b->core).field_0x8;
  uVar4 = (uint)(uVar5 >> 0x2e) & 0xfffffffc;
  uVar5 = uVar5 >> 0x18 & 0xff;
  iVar2 = (b->core).l_qseq;
  iVar6 = iVar2 + 1 >> 1;
  puVar3 = b->data;
  __src = skip_aux(s);
  memmove(s + -2,__src,
          (size_t)(puVar3 + (long)(int)(iVar1 - (iVar2 + (int)uVar5 + uVar4 + iVar6)) +
                            (((long)iVar6 + uVar5 + (long)iVar2 + (ulong)uVar4) - (long)__src)));
  b->l_data = b->l_data + ((int)(s + -2) - (int)__src);
  return 0;
}

Assistant:

int bam_aux_del(bam1_t *b, uint8_t *s)
{
    uint8_t *p, *aux;
    int l_aux = bam_get_l_aux(b);
    aux = bam_get_aux(b);
    p = s - 2;
    s = skip_aux(s);
    memmove(p, s, l_aux - (s - aux));
    b->l_data -= s - p;
    return 0;
}